

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QCircuit.hpp
# Opt level: O1

bool __thiscall
qclab::QCircuit<std::complex<double>,_qclab::qgates::QGate1<std::complex<double>_>_>::equals
          (QCircuit<std::complex<double>,_qclab::qgates::QGate1<std::complex<double>_>_> *this,
          QObject<std::complex<double>_> *other)

{
  double *pdVar1;
  double *pdVar2;
  double dVar3;
  bool bVar4;
  bool bVar5;
  long lVar6;
  double *pdVar7;
  long lVar8;
  double *pdVar9;
  long lVar10;
  long local_40;
  double *local_38;
  long local_30;
  double *local_28;
  
  (*other->_vptr_QObject[7])(&local_40);
  (*(this->super_QObject<std::complex<double>_>)._vptr_QObject[7])(&local_30,this);
  if (local_30 == local_40) {
    bVar5 = local_40 < 1;
    if (0 < local_40) {
      bVar4 = false;
      bVar5 = false;
      if ((*local_28 == *local_38) && (bVar5 = bVar4, !NAN(*local_28) && !NAN(*local_38))) {
        if ((local_28[1] == local_38[1]) && (!NAN(local_28[1]) && !NAN(local_38[1]))) {
          lVar6 = 0;
          bVar5 = false;
          pdVar7 = local_38;
          pdVar9 = local_28;
          do {
            lVar10 = 0x18;
            lVar8 = 0;
            while( true ) {
              if (local_40 + -1 == lVar8) goto LAB_0016486d;
              dVar3 = *(double *)((long)pdVar9 + lVar10 + -8);
              lVar8 = lVar8 + 1;
              pdVar2 = (double *)((long)pdVar7 + lVar10 + -8);
              if ((dVar3 != *pdVar2) || (NAN(dVar3) || NAN(*pdVar2))) break;
              pdVar2 = (double *)((long)pdVar9 + lVar10);
              pdVar1 = (double *)((long)pdVar7 + lVar10);
              lVar10 = lVar10 + 0x10;
              if ((*pdVar2 != *pdVar1) || (NAN(*pdVar2) || NAN(*pdVar1))) break;
            }
            if (lVar8 < local_40) break;
LAB_0016486d:
            lVar6 = lVar6 + 1;
            bVar5 = local_40 <= lVar6;
            if (lVar6 == local_40) break;
            if ((local_28[lVar6 * local_30 * 2] != local_38[lVar6 * local_40 * 2]) ||
               (NAN(local_28[lVar6 * local_30 * 2]) || NAN(local_38[lVar6 * local_40 * 2]))) break;
            pdVar9 = pdVar9 + local_30 * 2;
            pdVar7 = pdVar7 + local_40 * 2;
            if ((local_28[lVar6 * local_30 * 2 + 1] != local_38[lVar6 * local_40 * 2 + 1]) ||
               (NAN(local_28[lVar6 * local_30 * 2 + 1]) || NAN(local_38[lVar6 * local_40 * 2 + 1])))
            break;
          } while( true );
        }
      }
    }
  }
  else {
    bVar5 = false;
  }
  if (local_28 != (double *)0x0) {
    operator_delete__(local_28);
  }
  if (local_38 != (double *)0x0) {
    operator_delete__(local_38);
  }
  return bVar5;
}

Assistant:

inline bool equals( const QObject< T >& other ) const override {
        return ( other.matrix() == matrix() ) ;
      }